

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingDirectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingDirectionSyntax,slang::parsing::Token,slang::syntax::ClockingSkewSyntax*,slang::parsing::Token,slang::syntax::ClockingSkewSyntax*>
          (BumpAllocator *this,Token *args,ClockingSkewSyntax **args_1,Token *args_2,
          ClockingSkewSyntax **args_3)

{
  ClockingDirectionSyntax *this_00;
  ClockingSkewSyntax *in_RCX;
  Token *in_RSI;
  undefined8 *in_R8;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  this_00 = (ClockingDirectionSyntax *)
            allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  slang::syntax::ClockingDirectionSyntax::ClockingDirectionSyntax
            (this_00,*in_RSI,(ClockingSkewSyntax *)*in_R8,*(Token *)&in_RCX->super_SyntaxNode,in_RCX
            );
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }